

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

int nghttp2_hd_deflate_new2
              (nghttp2_hd_deflater **deflater_ptr,size_t deflate_hd_table_bufsize_max,
              nghttp2_mem *mem)

{
  int iVar1;
  nghttp2_hd_deflater *deflater;
  
  if (mem == (nghttp2_mem *)0x0) {
    mem = nghttp2_mem_default();
  }
  deflater = (nghttp2_hd_deflater *)nghttp2_mem_malloc(mem,0x458);
  if (deflater == (nghttp2_hd_deflater *)0x0) {
    iVar1 = -0x385;
  }
  else {
    iVar1 = nghttp2_hd_deflate_init2(deflater,deflate_hd_table_bufsize_max,mem);
    if (iVar1 == 0) {
      *deflater_ptr = deflater;
      iVar1 = 0;
    }
    else {
      nghttp2_mem_free(mem,deflater);
    }
  }
  return iVar1;
}

Assistant:

int nghttp2_hd_deflate_new2(nghttp2_hd_deflater **deflater_ptr,
                            size_t deflate_hd_table_bufsize_max,
                            nghttp2_mem *mem) {
  int rv;
  nghttp2_hd_deflater *deflater;

  if (mem == NULL) {
    mem = nghttp2_mem_default();
  }

  deflater = nghttp2_mem_malloc(mem, sizeof(nghttp2_hd_deflater));

  if (deflater == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  rv = nghttp2_hd_deflate_init2(deflater, deflate_hd_table_bufsize_max, mem);

  if (rv != 0) {
    nghttp2_mem_free(mem, deflater);

    return rv;
  }

  *deflater_ptr = deflater;

  return 0;
}